

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int chooseMaxTurns(void)

{
  __type local_d;
  int local_c [2];
  int numTurns;
  
  do {
    std::operator<<((ostream *)&std::cout,
                    "please choose the maximum number of turns to be played on each map (between 3 and 50) : \n"
                   );
    std::istream::operator>>((istream *)&std::cin,local_c);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    local_d = true;
    if ((2 < local_c[0]) && (local_d = true, local_c[0] < 0x33)) {
      local_d = std::isnan<int>(local_c[0]);
    }
  } while (local_d != false);
  return local_c[0];
}

Assistant:

static int chooseMaxTurns() {
    int numTurns;
    do {
        cout << "please choose the maximum number of turns to be played on each map (between 3 and 50) : \n";
        cin >> numTurns;
        cin.clear();
        cin.ignore(512, '\n');
    } while (numTurns < 3 || numTurns > 50 || isnan(numTurns));
    return int(numTurns);
}